

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alGetSourceiv(ALuint name,ALenum param,ALint *values)

{
  uint local_20;
  uint local_1c;
  uint32 i;
  uint32 numvals;
  ALint *values_local;
  ALenum param_local;
  ALuint name_local;
  
  local_1c = 1;
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetSourceiv);
  IO_UINT32(name);
  IO_ENUM(param);
  IO_PTR(values);
  if (((((param != 0x202) && (param != 0x1001)) && (param != 0x1002)) &&
      (((param != 0x1007 && (param != 0x1009)) &&
       ((param != 0x1010 && ((param != 0x1015 && (param != 0x1016)))))))) &&
     ((param != 0x1020 &&
      (((((param != 0x1021 && (param != 0x1023)) && (param != 0x1024)) &&
        ((param != 0x1025 && (param != 0x1026)))) && (param != 0x1027)))))) {
    local_1c = 0;
  }
  if (values == (ALint *)0x0) {
    local_1c = 0;
  }
  if (local_1c != 0) {
    memset(values,0,(ulong)local_1c << 2);
  }
  (*REAL_alGetSourceiv)(name,param,values);
  IO_UINT32(local_1c);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    IO_INT32(values[local_20]);
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetSourceiv(ALuint name, ALenum param, ALint *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alGetSourceiv);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_SOURCE_STATE: break;
        case AL_SOURCE_RELATIVE: break;
        case AL_LOOPING: break;
        case AL_BUFFER: break;
        case AL_BUFFERS_QUEUED: break;
        case AL_BUFFERS_PROCESSED: break;
        case AL_SOURCE_TYPE: break;
        case AL_REFERENCE_DISTANCE: break;
        case AL_ROLLOFF_FACTOR: break;
        case AL_MAX_DISTANCE: break;
        case AL_CONE_INNER_ANGLE: break;
        case AL_CONE_OUTER_ANGLE: break;
        case AL_SEC_OFFSET: break;
        case AL_SAMPLE_OFFSET: break;
        case AL_BYTE_OFFSET: break;
        default: numvals = 0; break;   /* uhoh. */
    }

    if (!values) { numvals = 0; }
    if (numvals) {
        memset(values, '\0', numvals * sizeof (ALint));
    }

    REAL_alGetSourceiv(name, param, values);

    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_INT32(values[i]);
    }

    IO_END();
}